

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodes.c
# Opt level: O0

void adc_75(void)

{
  ubyte uVar1;
  ubyte local_c;
  ushort local_a;
  uint answer;
  uint flags;
  
  except = '\0';
  uVar1 = getbyte(pc);
  temp1 = RAM[(byte)(uVar1 + x_reg)];
  asm("push ax");
  asm("CLC");
  if (carry_f != '\0') {
    asm("STC");
  }
  _AL = acc;
  _AH = temp1;
  asm("adc AL,AH");
  asm("pushf");
  asm("pop flags");
  asm("push AX");
  asm("pop answer");
  asm("pop AX");
  acc = local_c;
  result_f = local_c;
  ovr_f = (local_a & 0x800) != 0;
  carry_f = (byte)local_a & 1;
  pc = pc + 1;
  return;
}

Assistant:

void adc_75(void) {
    uint flags;
    uint answer;

    CLE;
    temp1 = RAM[(ubyte) (getbyte(pc) + x_reg)];

    asm("push ax");
    asm("CLC");

    if (carry_f) asm("STC");

    _AL = acc;
    _AH = temp1;

    asm("adc AL,AH");
    asm("pushf");
    asm("pop flags");
    asm("push AX");
    asm("pop answer");
    asm("pop AX");

    result_f = (acc = answer);
    (flags & 0x800) ? (ovr_f = 1) : (ovr_f = 0);
    carry_f = flags & 0x01;

    pc++;
}